

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

string * toString<std::__cxx11::string>
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *options)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_t i;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  allocator *paVar6;
  string local_1d8 [32];
  ulong local_1b8;
  undefined4 local_1b0;
  allocator local_199;
  stringstream local_198 [16];
  ostream local_188 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffe10);
  if (bVar2) {
    paVar6 = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  else {
    for (local_1b8 = 0; uVar1 = local_1b8,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_10), uVar1 < sVar4; local_1b8 = local_1b8 + 1) {
      std::__cxx11::stringstream::str();
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_1d8);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        std::operator<<(local_188,", ");
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_10,local_1b8);
      std::operator<<(local_188,(string *)pvVar5);
    }
    std::__cxx11::stringstream::str();
  }
  local_1b0 = 1;
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string toString(const std::vector<Type> &options)
{
    std::stringstream ss;
    if (options.empty()) return "";
    for (size_t i = 0; i < options.size(); i++)
    {
        if (not ss.str().empty()) ss << ", ";
        ss << options[i];
    }
    return ss.str();
}